

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::CommitDescriptorSets
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo,Uint32 CommitSRBMask)

{
  VkPipelineBindPoint pipelineBindPoint;
  ShaderResourceCacheVk *this_00;
  value_type pVVar1;
  VkPipelineLayout layout;
  uint32_t firstSet;
  Uint32 UVar2;
  Uint32 UVar3;
  Uint32 UVar4;
  Char *pCVar5;
  PipelineStateVkImpl *this_01;
  reference pvVar6;
  reference ppVVar7;
  reference ppVVar8;
  reference ppSVar9;
  size_type sVar10;
  pointer pDescriptorSets;
  uint *pDynamicOffsets;
  char (*Args_1) [63];
  uint uVar11;
  ulong uVar12;
  char (*in_R8) [50];
  undefined1 local_1a0 [8];
  string msg_9;
  string msg_8;
  undefined1 local_158 [4];
  Uint32 NumOffsetsWritten;
  string msg_7;
  string msg_6;
  ShaderResourceCacheVk *pResourceCache;
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  DescriptorSetInfo *SetInfo;
  Uint32 sign;
  Uint32 FirstSetToBind;
  uint32_t TotalSetCount;
  uint32_t DynamicOffsetCount;
  string msg_1;
  Uint32 LastSign;
  Uint32 FirstSign;
  undefined1 local_40 [8];
  string msg;
  Uint32 CommitSRBMask_local;
  ResourceBindInfo *BindInfo_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._12_4_ = CommitSRBMask;
  if (CommitSRBMask == 0) {
    FormatString<char[65]>
              ((string *)local_40,
               (char (*) [65])"This method should not be called when there is nothing to commit");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a4);
    std::__cxx11::string::~string((string *)local_40);
  }
  UVar2 = LinuxMisc::GetLSB(msg.field_2._12_4_);
  UVar3 = LinuxMisc::GetMSB(msg.field_2._12_4_);
  msg_1.field_2._12_4_ = UVar3;
  this_01 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
  UVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                    (&this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  Args_1 = (char (*) [63])(ulong)UVar4;
  if (UVar4 <= UVar3) {
    FormatString<char[26],char[57]>
              ((string *)&TotalSetCount,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LastSign < m_pPipelineState->GetResourceSignatureCount()",
               (char (*) [57])Args_1);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [63])0x1a8;
    DebugAssertionFailed
              (pCVar5,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1a8);
    std::__cxx11::string::~string((string *)&TotalSetCount);
  }
  FirstSetToBind = 0;
  sign = 0;
  pvVar6 = std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL>::
           operator[](&BindInfo->SetInfo,(ulong)UVar2);
  SetInfo._4_4_ = pvVar6->BaseInd;
  for (SetInfo._0_4_ = UVar2; (Uint32)SetInfo <= (uint)msg_1.field_2._12_4_;
      SetInfo._0_4_ = (Uint32)SetInfo + 1) {
    pvVar6 = std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL>::
             operator[](&BindInfo->SetInfo,(ulong)(Uint32)SetInfo);
    ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,0);
    if ((*ppVVar7 == (value_type)0x0) &&
       ((msg.field_2._12_4_ & 1 << ((byte)(Uint32)SetInfo & 0x1f)) != 0)) {
      FormatString<char[131]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [131])
                 "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()"
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"CommitDescriptorSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x1b2);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    uVar11 = 1 << ((byte)(Uint32)SetInfo & 0x1f);
    Args_1 = (char (*) [63])(ulong)uVar11;
    if ((((BindInfo->super_CommittedShaderResources).ActiveSRBMask & uVar11) == 0) &&
       (ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,0),
       *ppVVar7 != (value_type)0x0)) {
      FormatString<char[48]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [48])"Descriptor sets must be null for inactive slots");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (char (*) [63])0x1b4;
      DebugAssertionFailed
                (pCVar5,"CommitDescriptorSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x1b4);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,0);
    if (*ppVVar7 == (value_type)0x0) {
      ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,1);
      if (*ppVVar7 != (value_type)0x0) {
        FormatString<char[26],char[36]>
                  ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SetInfo.vkSets[1] == VK_NULL_HANDLE",(char (*) [36])Args_1);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        Args_1 = (char (*) [63])0x1b7;
        DebugAssertionFailed
                  (pCVar5,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1b7);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
    }
    else {
      if (pvVar6->BaseInd < SetInfo._4_4_ + sign) {
        FormatString<char[26],char[50]>
                  ((string *)&pResourceCache,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SetInfo.BaseInd >= FirstSetToBind + TotalSetCount",
                   (char (*) [50])(ulong)(SetInfo._4_4_ + sign));
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1bb);
        std::__cxx11::string::~string((string *)&pResourceCache);
      }
      while (SetInfo._4_4_ + sign < pvVar6->BaseInd) {
        uVar12 = (ulong)sign;
        sign = sign + 1;
        ppVVar8 = std::array<VkDescriptorSet_T_*,_16UL>::operator[](&this->m_DescriptorSets,uVar12);
        *ppVVar8 = (value_type)0x0;
      }
      ppSVar9 = std::array<Diligent::ShaderResourceCacheVk_*,_8UL>::operator[]
                          ((array<Diligent::ShaderResourceCacheVk_*,_8UL> *)BindInfo,
                           (ulong)(Uint32)SetInfo);
      this_00 = *ppSVar9;
      if (this_00 == (ShaderResourceCacheVk *)0x0) {
        FormatString<char[33],unsigned_int,char[50]>
                  ((string *)((long)&msg_7.field_2 + 8),
                   (Diligent *)"Resource cache at binding index ",(char (*) [33])&SetInfo,
                   (uint *)" is null, but corresponding descriptor set is not",in_R8);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"CommitDescriptorSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1c0);
        std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
      }
      ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,0);
      pVVar1 = *ppVVar7;
      uVar12 = (ulong)sign;
      sign = sign + 1;
      ppVVar8 = std::array<VkDescriptorSet_T_*,_16UL>::operator[](&this->m_DescriptorSets,uVar12);
      *ppVVar8 = pVVar1;
      ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,1);
      if (*ppVVar7 != (value_type)0x0) {
        ppVVar7 = std::array<VkDescriptorSet_T_*,_2UL>::operator[](&pvVar6->vkSets,1);
        pVVar1 = *ppVVar7;
        uVar12 = (ulong)sign;
        sign = sign + 1;
        ppVVar8 = std::array<VkDescriptorSet_T_*,_16UL>::operator[](&this->m_DescriptorSets,uVar12);
        *ppVVar8 = pVVar1;
      }
      if (pvVar6->DynamicOffsetCount != 0) {
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (&this->m_DynamicBufferOffsets);
        if (sVar10 < (ulong)FirstSetToBind + (ulong)pvVar6->DynamicOffsetCount) {
          FormatString<char[87]>
                    ((string *)local_158,
                     (char (*) [87])
                     "m_DynamicBufferOffsets must\'ve been resized by SetPipelineState() to have enough space"
                    );
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1c9);
          std::__cxx11::string::~string((string *)local_158);
        }
        UVar2 = ShaderResourceCacheVk::GetDynamicBufferOffsets
                          (this_00,this,&this->m_DynamicBufferOffsets,FirstSetToBind);
        if (UVar2 != pvVar6->DynamicOffsetCount) {
          FormatString<char[26],char[48]>
                    ((string *)((long)&msg_9.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"NumOffsetsWritten == SetInfo.DynamicOffsetCount",
                     (char (*) [48])pvVar6);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"CommitDescriptorSets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1cc);
          std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
        }
        FirstSetToBind = pvVar6->DynamicOffsetCount + FirstSetToBind;
      }
      Args_1 = (char (*) [63])(ulong)pvVar6->BaseInd;
      pvVar6->LastBoundBaseInd = pvVar6->BaseInd;
    }
  }
  if ((this->m_State).vkPipelineBindPoint == VK_PIPELINE_BIND_POINT_MAX_ENUM) {
    FormatString<char[26],char[63]>
              ((string *)local_1a0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM",
               Args_1);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"CommitDescriptorSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1dd);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  UVar2 = sign;
  firstSet = SetInfo._4_4_;
  pipelineBindPoint = (this->m_State).vkPipelineBindPoint;
  layout = BindInfo->vkPipelineLayout;
  pDescriptorSets = std::array<VkDescriptorSet_T_*,_16UL>::data(&this->m_DescriptorSets);
  UVar3 = FirstSetToBind;
  pDynamicOffsets =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->m_DynamicBufferOffsets)
  ;
  VulkanUtilities::VulkanCommandBuffer::BindDescriptorSets
            (&this->m_CommandBuffer,pipelineBindPoint,layout,firstSet,UVar2,pDescriptorSets,UVar3,
             pDynamicOffsets);
  (BindInfo->super_CommittedShaderResources).StaleSRBMask =
       (BindInfo->super_CommittedShaderResources).StaleSRBMask &
       ((BindInfo->super_CommittedShaderResources).ActiveSRBMask ^ 0xff);
  return;
}

Assistant:

void DeviceContextVkImpl::CommitDescriptorSets(ResourceBindInfo& BindInfo, Uint32 CommitSRBMask)
{
    VERIFY(CommitSRBMask != 0, "This method should not be called when there is nothing to commit");

    const Uint32 FirstSign = PlatformMisc::GetLSB(CommitSRBMask);
    const Uint32 LastSign  = PlatformMisc::GetMSB(CommitSRBMask);
    VERIFY_EXPR(LastSign < m_pPipelineState->GetResourceSignatureCount());

    // Bind all descriptor sets in a single BindDescriptorSets call
    uint32_t     DynamicOffsetCount = 0;
    uint32_t     TotalSetCount      = 0;
    const Uint32 FirstSetToBind     = BindInfo.SetInfo[FirstSign].BaseInd;
    for (Uint32 sign = FirstSign; sign <= LastSign; ++sign)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[sign];
        VERIFY(SetInfo.vkSets[0] != VK_NULL_HANDLE || (CommitSRBMask & (1u << sign)) == 0,
               "At least one descriptor set in the stale SRB must not be NULL. Empty SRBs should not be marked as stale by CommitShaderResources()");

        VERIFY((BindInfo.ActiveSRBMask & (1u << sign)) != 0 || SetInfo.vkSets[0] == VK_NULL_HANDLE, "Descriptor sets must be null for inactive slots");
        if (SetInfo.vkSets[0] == VK_NULL_HANDLE)
        {
            VERIFY_EXPR(SetInfo.vkSets[1] == VK_NULL_HANDLE);
            continue;
        }

        VERIFY_EXPR(SetInfo.BaseInd >= FirstSetToBind + TotalSetCount);
        while (FirstSetToBind + TotalSetCount < SetInfo.BaseInd)
            m_DescriptorSets[TotalSetCount++] = VK_NULL_HANDLE;

        const ShaderResourceCacheVk* pResourceCache = BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at binding index ", sign, " is null, but corresponding descriptor set is not");

        m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[0];
        if (SetInfo.vkSets[1] != VK_NULL_HANDLE)
            m_DescriptorSets[TotalSetCount++] = SetInfo.vkSets[1];

        if (SetInfo.DynamicOffsetCount > 0)
        {
            VERIFY(m_DynamicBufferOffsets.size() >= size_t{DynamicOffsetCount} + size_t{SetInfo.DynamicOffsetCount},
                   "m_DynamicBufferOffsets must've been resized by SetPipelineState() to have enough space");

            Uint32 NumOffsetsWritten = pResourceCache->GetDynamicBufferOffsets(this, m_DynamicBufferOffsets, DynamicOffsetCount);
            VERIFY_EXPR(NumOffsetsWritten == SetInfo.DynamicOffsetCount);
            DynamicOffsetCount += SetInfo.DynamicOffsetCount;
        }

#ifdef DILIGENT_DEVELOPMENT
        SetInfo.LastBoundBaseInd = SetInfo.BaseInd;
#endif
    }

    // Note that there is one global dynamic buffer from which all dynamic resources are suballocated in Vulkan back-end,
    // and this buffer is not resizable, so the buffer handle can never change.

    // vkCmdBindDescriptorSets causes the sets numbered [firstSet .. firstSet+descriptorSetCount-1] to use the
    // bindings stored in pDescriptorSets[0 .. descriptorSetCount-1] for subsequent rendering commands
    // (either compute or graphics, according to the pipelineBindPoint). Any bindings that were previously
    // applied via these sets are no longer valid.
    // https://www.khronos.org/registry/vulkan/specs/1.3-extensions/man/html/vkCmdBindDescriptorSets.html
    VERIFY_EXPR(m_State.vkPipelineBindPoint != VK_PIPELINE_BIND_POINT_MAX_ENUM);
    m_CommandBuffer.BindDescriptorSets(m_State.vkPipelineBindPoint, BindInfo.vkPipelineLayout, FirstSetToBind, TotalSetCount,
                                       m_DescriptorSets.data(), DynamicOffsetCount, m_DynamicBufferOffsets.data());

    BindInfo.StaleSRBMask &= ~BindInfo.ActiveSRBMask;
}